

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_LengthValue *
ON_LengthValue::CreateFromSubString
          (ON_LengthValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  ON_ParseSettings parse_settings_00;
  LengthUnitSystem length_unit_system;
  AngleUnitSystem AVar1;
  uint length;
  uint uVar2;
  double length_value;
  ON_ParseSettings parse_results;
  LengthUnitSystem local_71;
  ON_UnitSystem local_70;
  double local_58;
  ON_ParseSettings local_50;
  
  if (string_end != (wchar_t **)0x0) {
    *string_end = string;
  }
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x94,"","Invalid string_count parameter.");
  }
  else if ((string_count != 0 && string != (wchar_t *)0x0) && (*string != L'\0')) {
    local_58 = ON_DBL_QNAN;
    ON_ParseSettings::ON_ParseSettings(&local_50);
    local_71 = Unset;
    parse_settings_00.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = parse_settings.m_reserved;
    length = ON_ParseLengthExpression
                       (string,string_count,parse_settings_00,&local_58,&local_50,&local_71);
    if ((0 < (int)length) &&
       ((string_count == -1 || (int)length <= string_count && (!NAN(local_58))))) {
      ON_LengthValue(__return_storage_ptr__);
      __return_storage_ptr__->m_length = local_58;
      if ((byte)(local_71 - Microns) < 0xfe) {
        ON_UnitSystem::ON_UnitSystem(&local_70,local_71);
        ON_UnitSystem::operator=(&__return_storage_ptr__->m_length_unit_system,&local_70);
      }
      else {
        length_unit_system = ON_ParseSettings::ContextLengthUnitSystem(&parse_settings);
        ON_UnitSystem::ON_UnitSystem(&local_70,length_unit_system);
        ON_UnitSystem::operator=(&__return_storage_ptr__->m_length_unit_system,&local_70);
      }
      ON_wString::~ON_wString(&local_70.m_custom_unit_name);
      AVar1 = ON_ParseSettings::ContextAngleUnitSystem(&parse_settings);
      __return_storage_ptr__->m_context_angle_unit_system = AVar1;
      uVar2 = ON_ParseSettings::ContextLocaleId(&parse_settings);
      __return_storage_ptr__->m_context_locale_id = uVar2;
      ON_wString::ON_wString((ON_wString *)&local_70,string,length);
      ON_wString::operator=(&__return_storage_ptr__->m_length_as_string,(ON_wString *)&local_70);
      ON_wString::~ON_wString((ON_wString *)&local_70);
      ON_wString::TrimLeftAndRight(&__return_storage_ptr__->m_length_as_string,(wchar_t *)0x0);
      if (string_end == (wchar_t **)0x0) {
        return __return_storage_ptr__;
      }
      *string_end = string + length;
      return __return_storage_ptr__;
    }
  }
  ON_LengthValue(__return_storage_ptr__,&Unset);
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::CreateFromSubString(
    ON_ParseSettings parse_settings,
    const wchar_t* string,
    int string_count,
    const wchar_t** string_end
  )
{
  // All calls to some version of ON_LengthValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_LengthValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_LengthValue::Unset;
  }

  double length_value = ON_DBL_QNAN;
  ON_ParseSettings parse_results;
  ON::LengthUnitSystem string_length_unit_system = ON::LengthUnitSystem::Unset;
  const int parse_count = ON_ParseLengthExpression(
    string,
    string_count,
    parse_settings, 
    &length_value,
    &parse_results,
    &string_length_unit_system
  );

  if ( parse_count <= 0 
    || (parse_count > string_count && string_count >= 0)
    || false == (length_value == length_value) 
    ) 
  {
    // Calling ON_ERROR HERE .NET wrapper trauma when CreateFromSubString() is used for string validation.
    // ON_ERROR("Input string parameter is not valid.");
    return ON_LengthValue::Unset;
  }

  ON_LengthValue rc;

  rc.m_length = length_value;

  if (ON::LengthUnitSystem::Unset != string_length_unit_system && ON::LengthUnitSystem::None != string_length_unit_system)
    rc.m_length_unit_system = ON_UnitSystem(string_length_unit_system);
  else
    rc.m_length_unit_system = ON_UnitSystem(parse_settings.ContextLengthUnitSystem());

  rc.m_context_angle_unit_system = parse_settings.ContextAngleUnitSystem();
  rc.m_context_locale_id = parse_settings.ContextLocaleId();

  rc.m_length_as_string = ON_wString(string, parse_count);
  rc.m_length_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = string + parse_count;

  return rc;
}